

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_fb33fd::HandleTransformCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  _Link_type p_Var3;
  cmMakefile *pcVar4;
  TransformAction TVar5;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  code *pcVar8;
  undefined8 uVar9;
  cmExecutionStatus *pcVar10;
  bool bVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  _Link_type p_Var16;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Var17;
  string *psVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> _Var22;
  undefined8 uVar23;
  runtime_error *prVar24;
  ActionDescriptor *__args;
  ActionDescriptor *__args_00;
  _Rb_tree_node_base *p_Var25;
  pointer pbVar26;
  ulong uVar27;
  _Base_ptr p_Var28;
  _Alloc_hider _Var29;
  pointer pbVar30;
  long lVar31;
  ulong uVar32;
  _Link_type __node;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view separator;
  string_view value_00;
  string_view separator_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string REGEX;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  int value;
  Command command;
  string FOR;
  string OUTPUT_VARIABLE;
  _Link_type local_628;
  _Link_type local_620;
  undefined1 local_608 [56];
  string local_5d0;
  cmExecutionStatus *local_5b0;
  _Rb_tree_node_base *local_5a8;
  int local_59c;
  string local_598;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  undefined8 uStack_560;
  undefined1 *local_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined7 uStack_547;
  undefined8 uStack_540;
  _Any_data local_538;
  long local_528;
  code *local_520;
  undefined1 local_518 [44];
  uchar auStack_4ec [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  uchar local_4c0;
  uchar auStack_4bf [7];
  uchar auStack_4b8 [8];
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined8 uStack_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined1 local_480;
  undefined7 uStack_47f;
  undefined8 uStack_478;
  char *local_470;
  undefined8 local_468;
  char local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_450;
  undefined8 local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  undefined1 local_430 [32];
  string local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Stack_3d8;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> local_3d0;
  string local_3c8;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  ulong local_388;
  Command *local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  code *pcStack_368;
  char *local_360;
  undefined8 local_358;
  char local_350 [8];
  undefined8 uStack_348;
  undefined4 local_340;
  Command *local_338;
  undefined8 uStack_330;
  code *local_328;
  code *local_320;
  undefined1 *local_318;
  undefined8 local_310;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  undefined4 local_2f8;
  Command *local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [8];
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  Command *local_2a8;
  undefined8 uStack_2a0;
  code *local_298;
  code *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  undefined4 local_268;
  Command *local_260;
  undefined8 uStack_258;
  code *local_250;
  code *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230 [8];
  undefined8 uStack_228;
  undefined4 local_220;
  Command *local_218;
  undefined8 uStack_210;
  code *local_208;
  code *local_200;
  _Link_type local_1f8 [2];
  undefined1 local_1e8 [40];
  code *local_1c0 [3];
  long *local_1a8;
  size_t local_1a0;
  long local_198 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  long local_158 [2];
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  code *local_118;
  undefined8 uStack_110;
  Command *local_108;
  undefined8 uStack_100;
  code *local_f8;
  undefined8 uStack_f0;
  Command *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  undefined8 uStack_d0;
  Command *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  Command *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  Command *local_88;
  undefined8 uStack_80;
  code *local_78;
  undefined8 uStack_70;
  Command *local_68;
  undefined8 uStack_60;
  code *local_58;
  undefined8 uStack_50;
  cmStringRange local_40;
  
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26) < 0x41) {
    local_3a8._0_8_ = &local_398;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3a8,"sub-command TRANSFORM requires an action to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ != &local_398) {
      operator_delete((void *)local_3a8._0_8_,
                      CONCAT26(local_398._M_allocated_capacity._6_2_,
                               CONCAT15(local_398._M_local_buf[5],
                                        CONCAT14(local_398._M_local_buf[4],
                                                 CONCAT13(local_398._M_local_buf[3],
                                                          CONCAT12(local_398._M_local_buf[2],
                                                                   CONCAT11(local_398._M_local_buf
                                                                            [1],local_398.
                                                                                _M_local_buf[0])))))
                              ) + 1);
    }
    return false;
  }
  local_430._0_8_ = &(((Command *)local_430)->Name).field_2;
  local_430._8_8_ = 0;
  local_430[0x10] = '\0';
  local_410._M_dataplus._M_p = (pointer)&(((Command *)local_430)->ListName).field_2;
  pcVar2 = pbVar26[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_430)->ListName,pcVar2,pcVar2 + pbVar26[1]._M_string_length
            );
  local_3c8._M_dataplus._M_p = (pointer)&(((Command *)local_430)->OutputName).field_2;
  local_3f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_3d8._M_head_impl = (TransformAction *)0x0;
  local_3f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0._M_head_impl = (TransformSelector *)0x0;
  pcVar2 = pbVar26[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_430)->OutputName,pcVar2,
             pcVar2 + pbVar26[1]._M_string_length);
  local_3a8._0_8_ = (void *)0x0;
  local_3a8._8_8_ = 0;
  local_398._8_3_ = 0x333448;
  local_398._11_2_ = 0;
  local_398._13_2_ = 0;
  local_398._M_local_buf[0xf] = '\0';
  local_398._M_local_buf[0] = 'b';
  local_398._M_local_buf[1] = '4';
  local_398._M_local_buf[2] = '3';
  local_398._M_local_buf[3] = '\0';
  local_398._M_local_buf[4] = '\0';
  local_398._M_local_buf[5] = '\0';
  local_398._M_allocated_capacity._6_2_ = 0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_538,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_3a8);
  local_518._16_8_ = local_518;
  local_518._0_4_ = _S_red;
  local_518._8_8_ = (_Rb_tree_node_base *)0x0;
  local_518[0x20] = '\0';
  local_518[0x21] = '\0';
  local_518[0x22] = '\0';
  local_518[0x23] = '\0';
  local_518[0x24] = '\0';
  local_518[0x25] = '\0';
  local_518[0x26] = '\0';
  local_518[0x27] = '\0';
  pcVar8 = (code *)CONCAT26(local_398._M_allocated_capacity._6_2_,
                            CONCAT15(local_398._M_local_buf[5],
                                     CONCAT14(local_398._M_local_buf[4],
                                              CONCAT13(local_398._M_local_buf[3],
                                                       CONCAT12(local_398._M_local_buf[2],
                                                                CONCAT11(local_398._M_local_buf[1],
                                                                         local_398._M_local_buf[0]))
                                                      ))));
  local_518._24_8_ = local_518._16_8_;
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(local_3a8,local_3a8,3);
  }
  local_450 = &local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"APPEND","");
  uStack_60 = 0;
  local_3a8._0_8_ = &local_398;
  local_398._M_local_buf[2] = (char)((uint7)local_440._1_7_ >> 8);
  local_398._M_local_buf[3] = (char)((uint7)local_440._1_7_ >> 0x10);
  local_398._M_local_buf[4] = (char)((uint7)local_440._1_7_ >> 0x18);
  local_398._M_local_buf[5] = (char)((uint7)local_440._1_7_ >> 0x20);
  local_398._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_440._1_7_ >> 0x28);
  if (local_450 == &local_440) {
    local_398._8_3_ = (undefined3)local_440._8_8_;
    local_398._11_2_ = (undefined2)((ulong)local_440._8_8_ >> 0x18);
    local_398._13_2_ = (undefined2)((ulong)local_440._8_8_ >> 0x28);
    local_398._M_local_buf[0xf] = (char)((ulong)local_440._8_8_ >> 0x38);
  }
  else {
    local_3a8._0_8_ = local_450;
  }
  local_398._M_local_buf[1] = (char)local_440._M_allocated_capacity._1_7_;
  local_3a8._8_8_ = local_448;
  local_448 = 0;
  local_440._M_local_buf[0] = '\0';
  local_388 = CONCAT44(local_388._4_4_,1);
  pcStack_368 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
                ::_M_invoke;
  paStack_378 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
                 ::_M_manager;
  local_58 = (code *)0x0;
  uStack_50 = 0;
  local_470 = &local_460;
  local_450 = &local_440;
  local_380 = (Command *)local_430;
  local_68 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"PREPEND","");
  uStack_80 = 0;
  local_360 = local_350;
  if (local_470 == &local_460) {
    uStack_348 = uStack_458;
  }
  else {
    local_360 = local_470;
  }
  local_358 = local_468;
  local_468 = 0;
  local_460 = '\0';
  local_340 = 1;
  local_320 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
              ::_M_invoke;
  uStack_330 = 0;
  local_328 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
              ::_M_manager;
  local_78 = (code *)0x0;
  uStack_70 = 0;
  local_490 = &local_480;
  local_470 = &local_460;
  local_338 = (Command *)local_430;
  local_88 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"TOUPPER","");
  uStack_a0 = 0;
  local_318 = local_308;
  if (local_490 == &local_480) {
    uStack_300 = uStack_478;
  }
  else {
    local_318 = local_490;
  }
  local_310 = local_488;
  local_488 = 0;
  local_480 = 0;
  local_2f8 = 0;
  local_2d8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
              ::_M_invoke;
  uStack_2e8 = 0;
  local_2e0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
              ::_M_manager;
  local_98 = (code *)0x0;
  uStack_90 = 0;
  local_558 = &local_548;
  local_490 = &local_480;
  local_2f0 = (Command *)local_430;
  local_a8 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"TOLOWER","");
  uStack_c0 = 0;
  local_2d0 = local_2c0;
  if (local_558 == &local_548) {
    uStack_2b8 = uStack_540;
  }
  else {
    local_2d0 = local_558;
  }
  local_2c8 = local_550;
  local_550 = 0;
  local_548 = 0;
  local_2b0 = 0;
  local_290 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
              ::_M_invoke;
  uStack_2a0 = 0;
  local_298 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
              ::_M_manager;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  local_578 = &local_568;
  local_558 = &local_548;
  local_2a8 = (Command *)local_430;
  local_c8 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"STRIP","");
  uStack_e0 = 0;
  local_288 = local_278;
  if (local_578 == &local_568) {
    uStack_270 = uStack_560;
  }
  else {
    local_288 = local_578;
  }
  local_280 = local_570;
  local_570 = 0;
  local_568 = 0;
  local_268 = 0;
  local_248 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
              ::_M_invoke;
  uStack_258 = 0;
  local_250 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
              ::_M_manager;
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_578 = &local_568;
  local_4b0 = &local_4a0;
  local_260 = (Command *)local_430;
  local_e8 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"GENEX_STRIP","");
  uStack_100 = 0;
  local_240 = local_230;
  if (local_4b0 == &local_4a0) {
    uStack_228 = uStack_498;
  }
  else {
    local_240 = local_4b0;
  }
  local_238 = local_4a8;
  local_4a8 = 0;
  local_4a0 = 0;
  local_220 = 0;
  local_200 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
              ::_M_invoke;
  uStack_210 = 0;
  local_208 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
              ::_M_manager;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_4d0._M_allocated_capacity = (size_type)&local_4c0;
  local_4b0 = &local_4a0;
  local_218 = (Command *)local_430;
  local_108 = (Command *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"REPLACE","");
  uVar23 = local_4d0._8_8_;
  local_128._8_8_ = 0;
  local_1f8[0] = (_Link_type)local_1e8;
  if ((uchar *)local_4d0._M_allocated_capacity == &local_4c0) {
    local_1e8[8] = auStack_4b8[0];
    local_1e8[9] = auStack_4b8[1];
    local_1e8[10] = auStack_4b8[2];
    local_1e8[0xb] = auStack_4b8[3];
    local_1e8[0xc] = auStack_4b8[4];
    local_1e8[0xd] = auStack_4b8[5];
    local_1e8[0xe] = auStack_4b8[6];
    local_1e8[0xf] = auStack_4b8[7];
  }
  else {
    local_1f8[0] = (_Link_type)local_4d0._M_allocated_capacity;
  }
  local_1f8[1] = (_Link_type)local_4d0._8_8_;
  local_4d0._M_local_buf[8] = '\0';
  local_4d0._M_local_buf[9] = '\0';
  local_4d0._M_local_buf[10] = '\0';
  local_4d0._M_local_buf[0xb] = '\0';
  local_4d0._M_local_buf[0xc] = '\0';
  local_4d0._M_local_buf[0xd] = '\0';
  local_4d0._M_local_buf[0xe] = '\0';
  local_4d0._M_local_buf[0xf] = '\0';
  local_4c0 = '\0';
  local_1e8._16_4_ = 2;
  local_1c0[1] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
                 ::_M_invoke;
  local_1e8._32_8_ = 0;
  local_1c0[0] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
                 ::_M_manager;
  local_118 = (code *)0x0;
  uStack_110 = 0;
  local_5a8 = (_Rb_tree_node_base *)local_518._8_8_;
  if ((_Rb_tree_node_base *)local_518._8_8_ == (_Rb_tree_node_base *)0x0) {
    local_628 = (_Link_type)0x0;
  }
  else {
    *(_Base_ptr *)(local_518._8_8_ + 8) = (_Base_ptr)0x0;
    local_628 = (_Link_type)((_Rb_tree_node_base *)local_518._24_8_)->_M_left;
    if (local_628 == (_Link_type)0x0) {
      local_628 = (_Link_type)local_518._24_8_;
    }
  }
  local_518._8_8_ = (_Rb_tree_node_base *)0x0;
  local_518._16_8_ = local_518;
  local_518._32_8_ = 0;
  lVar31 = 0;
  local_5b0 = status;
  local_518._24_8_ = local_518._16_8_;
  local_4d0._M_allocated_capacity = (size_type)&local_4c0;
  local_1e8._24_8_ = (Command *)local_430;
  local_128._M_allocated_capacity = (size_type)(Command *)local_430;
  do {
    __node = (_Link_type)(local_3a8 + lVar31);
    if (local_518._32_8_ == 0) {
LAB_0032ed76:
      p_Var28 = (_Base_ptr)local_518._8_8_;
      if ((_Rb_tree_node_base *)local_518._8_8_ == (_Rb_tree_node_base *)0x0) {
        bVar11 = true;
        p_Var25 = (_Rb_tree_node_base *)local_518;
      }
      else {
        do {
          p_Var25 = p_Var28;
          if (local_528 == 0) goto LAB_003306be;
          uVar23 = __node;
          bVar11 = (*local_520)(&local_538,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(p_Var25 + 1));
          p_Var28 = (&p_Var25->_M_left)[!bVar11];
        } while (p_Var28 != (_Base_ptr)0x0);
      }
      p_Var15 = p_Var25;
      if (bVar11 == false) {
LAB_0032ede0:
        if (local_528 == 0) {
LAB_003306be:
          std::__throw_bad_function_call();
        }
        uVar23 = p_Var15 + 1;
        bVar11 = (*local_520)(&local_538,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              uVar23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__node);
        if (!bVar11) {
          p_Var25 = (_Rb_tree_node_base *)0x0;
          p_Var28 = p_Var15;
        }
      }
      else if (p_Var25 != (_Rb_tree_node_base *)local_518._16_8_) {
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var25);
        goto LAB_0032ede0;
      }
      bVar11 = p_Var28 != (_Rb_tree_node_base *)0x0;
    }
    else {
      if (local_528 == 0) goto LAB_003306d3;
      uVar23 = local_518._24_8_ + 0x20;
      bVar11 = (*local_520)(&local_538,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            uVar23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__node);
      if (!bVar11) goto LAB_0032ed76;
      bVar11 = false;
      p_Var25 = (_Rb_tree_node_base *)local_518._24_8_;
    }
    if (p_Var25 != (_Rb_tree_node_base *)0x0) {
      bVar12 = true;
      if (!bVar11 && (_Rb_tree_node_base *)local_518 != p_Var25) {
        if (local_528 == 0) {
LAB_003306d3:
          std::__throw_bad_function_call();
        }
        uVar23 = __node;
        bVar12 = (*local_520)(&local_538,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var25 + 1));
      }
      if (local_628 == (_Link_type)0x0) {
        local_620 = local_628;
        local_628 = (_Link_type)0x0;
      }
      else {
        local_620 = (_Link_type)(local_628->super__Rb_tree_node_base)._M_parent;
        if (local_620 == (_Link_type)0x0) {
          local_5a8 = (_Rb_tree_node_base *)0x0;
        }
        else if ((_Link_type)(local_620->super__Rb_tree_node_base)._M_right == local_628) {
          (local_620->super__Rb_tree_node_base)._M_right = (_Base_ptr)0x0;
          p_Var3 = (_Link_type)(local_620->super__Rb_tree_node_base)._M_left;
          if (p_Var3 != (_Link_type)0x0) {
            do {
              p_Var16 = p_Var3;
              p_Var3 = (_Link_type)(p_Var16->super__Rb_tree_node_base)._M_right;
            } while (p_Var3 != (_Link_type)0x0);
            local_620 = (_Link_type)(p_Var16->super__Rb_tree_node_base)._M_left;
            if (local_620 == (_Link_type)0x0) {
              local_620 = p_Var16;
            }
          }
        }
        else {
          (local_620->super__Rb_tree_node_base)._M_left = (_Base_ptr)0x0;
        }
      }
      if (local_628 == (_Link_type)0x0) {
        uVar23 = operator_new(0x68);
        std::
        _Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
        ::
        _M_construct_node<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor_const&>
                  ((_Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
                    *)uVar23,__node,__args_00);
      }
      else {
        std::
        _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
        ::_M_destroy_node((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                           *)local_628,(_Link_type)uVar23);
        std::
        _Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
        ::
        _M_construct_node<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor_const&>
                  ((_Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
                    *)local_628,__node,__args);
        uVar23 = local_628;
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar12,(_Rb_tree_node_base *)uVar23,p_Var25,(_Rb_tree_node_base *)local_518);
      local_518._32_8_ = local_518._32_8_ + 1;
      local_628 = local_620;
    }
    lVar31 = lVar31 + 0x48;
  } while (lVar31 != 0x1f8);
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_M_erase((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
              *)local_5a8,(_Link_type)uVar23);
  lVar31 = 0;
  do {
    if (*(code **)((long)local_1c0 + lVar31) != (code *)0x0) {
      (**(code **)((long)local_1c0 + lVar31))(local_1e8 + lVar31 + 0x18,local_1e8 + lVar31 + 0x18,3)
      ;
    }
    if (local_1e8 + lVar31 != *(undefined1 **)((long)local_1f8 + lVar31)) {
      operator_delete(*(undefined1 **)((long)local_1f8 + lVar31),*(long *)(local_1e8 + lVar31) + 1);
    }
    lVar31 = lVar31 + -0x48;
  } while (lVar31 != -0x1f8);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,3);
  }
  if ((uchar *)local_4d0._M_allocated_capacity != &local_4c0) {
    operator_delete((void *)local_4d0._M_allocated_capacity,CONCAT71(auStack_4bf,local_4c0) + 1);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,CONCAT71(uStack_547,local_548) + 1);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,CONCAT71(uStack_47f,local_480) + 1);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,
                    CONCAT71(local_440._M_allocated_capacity._1_7_,local_440._M_local_buf[0]) + 1);
  }
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar26[2]._M_dataplus._M_p;
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar2,pcVar2 + pbVar26[2]._M_string_length);
  local_3a8._0_8_ = &local_398;
  local_398._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_178._1_7_ >> 0x28);
  local_398._M_local_buf[1] = (char)local_178._M_allocated_capacity._1_7_;
  local_398._M_local_buf[2] = (char)((uint7)local_178._1_7_ >> 8);
  local_398._M_local_buf[3] = (char)((uint7)local_178._1_7_ >> 0x10);
  local_398._M_local_buf[4] = (char)((uint7)local_178._1_7_ >> 0x18);
  local_398._M_local_buf[5] = (char)((uint7)local_178._1_7_ >> 0x20);
  if (local_188 == &local_178) {
    local_398._8_3_ = (undefined3)local_178._8_8_;
    local_398._11_2_ = (undefined2)((ulong)local_178._8_8_ >> 0x18);
    local_398._13_2_ = (undefined2)((ulong)local_178._8_8_ >> 0x28);
    local_398._M_local_buf[0xf] = (char)((ulong)local_178._8_8_ >> 0x38);
  }
  else {
    local_3a8._0_8_ = local_188;
  }
  local_398._M_local_buf[0] = local_178._M_local_buf[0];
  local_3a8._8_8_ = local_180;
  local_188 = &local_178;
  local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_178._M_local_buf[0] = '\0';
  local_388 = local_388 & 0xffffffff00000000;
  local_380 = (Command *)0x0;
  paStack_378 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  pcStack_368 = (code *)0x0;
  p_Var25 = (_Rb_tree_node_base *)local_518;
  if ((_Rb_tree_node_base *)local_518._8_8_ != (_Rb_tree_node_base *)0x0) {
    p_Var28 = (_Base_ptr)local_518._8_8_;
    do {
      if (local_528 == 0) goto LAB_003306d8;
      bVar11 = (*local_520)(&local_538,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var28 + 1),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3a8);
      if (!bVar11) {
        p_Var25 = p_Var28;
      }
      p_Var28 = (&p_Var28->_M_left)[bVar11];
    } while (p_Var28 != (_Base_ptr)0x0);
  }
  p_Var15 = (_Rb_tree_node_base *)local_518;
  if (p_Var25 != (_Rb_tree_node_base *)local_518) {
    if (local_528 == 0) {
LAB_003306d8:
      std::__throw_bad_function_call();
    }
    bVar11 = (*local_520)(&local_538,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3a8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var25 + 1));
    p_Var15 = p_Var25;
    if (bVar11) {
      p_Var15 = (_Rb_tree_node_base *)local_518;
    }
  }
  if (local_370 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*(code *)local_370)(&local_380,&local_380,3);
  }
  pcVar10 = local_5b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != &local_398) {
    operator_delete((void *)local_3a8._0_8_,
                    CONCAT26(local_398._M_allocated_capacity._6_2_,
                             CONCAT15(local_398._M_local_buf[5],
                                      CONCAT14(local_398._M_local_buf[4],
                                               CONCAT13(local_398._M_local_buf[3],
                                                        CONCAT12(local_398._M_local_buf[2],
                                                                 CONCAT11(local_398._M_local_buf[1],
                                                                          local_398._M_local_buf[0])
                                                                ))))) + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,
                    CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1);
  }
  if (p_Var15 == (_Rb_tree_node_base *)local_518) {
    pbVar26 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar26[2]._M_dataplus._M_p;
    sVar7 = pbVar26[2]._M_string_length;
    local_3a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x18;
    local_3a8._8_8_ = " sub-command TRANSFORM, ";
    local_398._M_local_buf[0] = (char)sVar7;
    local_398._M_local_buf[1] = (char)(sVar7 >> 8);
    local_398._M_local_buf[2] = (char)(sVar7 >> 0x10);
    local_398._M_local_buf[3] = (char)(sVar7 >> 0x18);
    local_398._M_local_buf[4] = (char)(sVar7 >> 0x20);
    local_398._M_local_buf[5] = (char)(sVar7 >> 0x28);
    local_398._M_allocated_capacity._6_2_ = (undefined2)(sVar7 >> 0x30);
    local_398._8_3_ = SUB83(pcVar2,0);
    local_398._11_2_ = (undefined2)((ulong)pcVar2 >> 0x18);
    local_398._13_2_ = (undefined2)((ulong)pcVar2 >> 0x28);
    local_398._M_local_buf[0xf] = (char)((ulong)pcVar2 >> 0x38);
    local_388 = 0x10;
    local_380 = (Command *)0x710672;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_3a8;
    cmCatViews_abi_cxx11_((string *)local_608,views_00);
    std::__cxx11::string::_M_assign((string *)&pcVar10->Error);
    local_5d0.field_2._M_allocated_capacity = local_608._16_8_;
    _Var29._M_p = (pointer)local_608._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_608 + 0x10)) {
LAB_0032f4bc:
      operator_delete(_Var29._M_p,
                      (ulong)((long)&(((pointer)local_5d0.field_2._M_allocated_capacity)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  else {
    if ((long)(int)p_Var15[2]._M_color + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)local_430);
      local_628 = (_Link_type)((long)(int)p_Var15[2]._M_color + 3);
      if (0 < (long)(int)p_Var15[2]._M_color) {
        pbVar26 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_608,
                   pbVar26 + 3,pbVar26 + (long)local_628,(allocator_type *)&local_5d0);
        pbVar26 = local_3f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3a8._8_8_ =
             local_3f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_3a8._0_8_ =
             local_3f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_3f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_608._0_8_;
        local_3f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_608._8_8_;
        local_3f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_608._16_8_;
        local_398._M_local_buf[0] = (char)pbVar26;
        local_398._M_local_buf[1] = (char)((ulong)pbVar26 >> 8);
        local_398._M_local_buf[2] = (char)((ulong)pbVar26 >> 0x10);
        local_398._M_local_buf[3] = (char)((ulong)pbVar26 >> 0x18);
        local_398._M_local_buf[4] = (char)((ulong)pbVar26 >> 0x20);
        local_398._M_local_buf[5] = (char)((ulong)pbVar26 >> 0x28);
        local_398._M_allocated_capacity._6_2_ = (undefined2)((ulong)pbVar26 >> 0x30);
        local_608._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_608._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_608._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_608);
      }
      iVar14 = std::__cxx11::string::compare((char *)local_430);
      _Var17._M_head_impl = (TransformAction *)_Stack_3d8;
      if (iVar14 == 0) {
        pcVar4 = pcVar10->Makefile;
        _Var17._M_head_impl = (TransformAction *)operator_new(0x160);
        pbVar26 = local_3f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *_Var17._M_head_impl = (TransformAction)&PTR__TransformReplace_008cd1e0;
        local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5d0,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_3f0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity,
                   *(long *)((long)local_3f0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x28) +
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_3f0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity);
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)((long)_Var17._M_head_impl + 8),pbVar26,&local_5d0,
                   pcVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,
                          (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
        }
        cmMakefile::ClearMatches(pcVar4);
        if (((TransformAction *)((long)_Var17._M_head_impl + 0x108))->_vptr_TransformAction ==
            (_func_int **)0x0) {
          prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_3a8._0_8_ = 0x40;
          local_3a8._8_8_ = "sub-command TRANSFORM, action REPLACE: Failed to compile regex \"";
          local_608._8_8_ =
               (local_3f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus;
          local_608._0_8_ =
               *(long *)((long)local_3f0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8);
          cmStrCat<char[3]>(&local_598,(cmAlphaNum *)local_3a8,(cmAlphaNum *)local_608,
                            (char (*) [3])0x6eda00);
          std::runtime_error::runtime_error(prVar24,(string *)&local_598);
          *(undefined ***)prVar24 = &PTR__runtime_error_008cd230;
          __cxa_throw(prVar24,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)&((TransformAction *)((long)_Var17._M_head_impl + 0x118))->
                      _vptr_TransformAction == '\0') {
          prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_3a8._0_8_ = 0x27;
          local_3a8._8_8_ = "sub-command TRANSFORM, action REPLACE: ";
          local_608._8_8_ =
               ((TransformAction *)((long)_Var17._M_head_impl + 8))->_vptr_TransformAction;
          local_608._0_8_ =
               ((TransformAction *)((long)_Var17._M_head_impl + 0x10))->_vptr_TransformAction;
          cmStrCat<char[2]>(&local_598,(cmAlphaNum *)local_3a8,(cmAlphaNum *)local_608,
                            (char (*) [2])0x6ecf14);
          std::runtime_error::runtime_error(prVar24,(string *)&local_598);
          *(undefined ***)prVar24 = &PTR__runtime_error_008cd230;
          __cxa_throw(prVar24,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )_Stack_3d8._M_head_impl != (TransformAction *)0x0) {
          TVar5._vptr_TransformAction = (_Stack_3d8._M_head_impl)->_vptr_TransformAction;
          _Stack_3d8._M_head_impl = _Var17._M_head_impl;
          (*TVar5._vptr_TransformAction[1])();
          _Var17._M_head_impl = (TransformAction *)_Stack_3d8;
        }
      }
      _Stack_3d8._M_head_impl = _Var17._M_head_impl;
      local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"REGEX","");
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"AT","");
      local_1a8 = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"FOR","");
      local_168._M_allocated_capacity = (size_type)local_158;
      local_5a8 = p_Var15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"OUTPUT_VARIABLE","");
      pbVar26 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar30 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar32 = (long)pbVar30 - (long)pbVar26 >> 5;
      if (local_628 < uVar32) {
        psVar18 = &local_5b0->Error;
        do {
          sVar7 = local_5d0._M_string_length;
          lVar31 = (long)local_628 * 0x20;
          pbVar1 = pbVar26 + (long)local_628;
          __n = pbVar26[(long)local_628]._M_string_length;
          if (((__n == local_5d0._M_string_length) &&
              ((__n == 0 ||
               (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_5d0._M_dataplus._M_p,__n),
               iVar14 == 0)))) ||
             ((__n == local_598._M_string_length &&
              ((__n == 0 ||
               (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_598._M_dataplus._M_p,__n),
               iVar14 == 0)))))) {
LAB_0032f7cc:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_head_impl ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_0032f7dd;
LAB_003302bd:
            lVar31 = *(long *)((long)local_3d0._M_head_impl + 8);
            sVar7 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)local_3d0._M_head_impl + 0x10))->_M_allocated_capacity;
            local_3a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x33;
            local_3a8._8_8_ = "sub-command TRANSFORM, selector already specified (";
            local_398._M_local_buf[0] = (char)sVar7;
            local_398._M_local_buf[1] = (char)(sVar7 >> 8);
            local_398._M_local_buf[2] = (char)(sVar7 >> 0x10);
            local_398._M_local_buf[3] = (char)(sVar7 >> 0x18);
            local_398._M_local_buf[4] = (char)(sVar7 >> 0x20);
            local_398._M_local_buf[5] = (char)(sVar7 >> 0x28);
            local_398._M_allocated_capacity._6_2_ = (undefined2)(sVar7 >> 0x30);
            local_398._8_3_ = (undefined3)lVar31;
            local_398._11_2_ = (undefined2)((ulong)lVar31 >> 0x18);
            local_398._13_2_ = (undefined2)((ulong)lVar31 >> 0x28);
            local_398._M_local_buf[0xf] = (char)((ulong)lVar31 >> 0x38);
            local_388 = 2;
            local_380 = (Command *)0x6f5ad2;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_3a8;
            cmCatViews_abi_cxx11_((string *)local_608,views_01);
            std::__cxx11::string::_M_assign((string *)psVar18);
            local_148.field_2._M_allocated_capacity = local_608._16_8_;
            local_148._M_dataplus._M_p = (pointer)local_608._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_608 + 0x10)) goto LAB_00330556;
LAB_0033054e:
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)((long)&(((pointer)local_148.field_2._M_allocated_capacity)->
                                           _M_dataplus)._M_p + 1));
LAB_00330556:
            bVar11 = false;
            goto LAB_00330558;
          }
          if (__n == local_1a0) {
            if (__n == 0) goto LAB_0032f7cc;
            iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_1a8,__n);
            if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)
                local_3d0._M_head_impl ==
                (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0 ||
                iVar14 != 0) goto LAB_0032f7dd;
            goto LAB_003302bd;
          }
LAB_0032f7dd:
          if ((__n != sVar7) ||
             ((__n != 0 &&
              (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_5d0._M_dataplus._M_p,__n), iVar14 != 0
              )))) {
            if ((__n == local_598._M_string_length) &&
               ((__n == 0 ||
                (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_598._M_dataplus._M_p,__n),
                iVar14 == 0)))) {
              local_608._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_608._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_608._16_8_ = (pointer)0x0;
              pbVar26 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_628 = (_Link_type)((long)local_628 + 1);
              if (local_628 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26 >> 5)) {
                piVar19 = __errno_location();
                do {
                  paVar6 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             **)((long)&pbVar26[1]._M_dataplus._M_p + lVar31);
                  iVar14 = *piVar19;
                  *piVar19 = 0;
                  lVar20 = strtol(paVar6->_M_local_buf,(char **)local_3a8,10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._0_8_ == paVar6) {
                    uVar23 = std::__throw_invalid_argument("stoi");
                    goto LAB_003307f1;
                  }
                  if ((lVar20 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                    std::__throw_out_of_range("stoi");
                  }
                  if (*piVar19 == 0) {
                    *piVar19 = iVar14;
                  }
                  local_518._40_4_ = (undefined4)lVar20;
                  if (local_3a8._0_8_ - (long)paVar6 !=
                      *(long *)((long)&(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[1].
                                       _M_string_length + lVar31)) break;
                  if (local_608._8_8_ == local_608._16_8_) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_608,
                               (iterator)local_608._8_8_,(int *)(local_518 + 0x28));
                  }
                  else {
                    *(undefined4 *)local_608._8_8_ = local_518._40_4_;
                    local_608._8_8_ = local_608._8_8_ + 4;
                  }
                  pbVar26 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_628 = (_Link_type)((long)local_628 + 1);
                  lVar31 = lVar31 + 0x20;
                } while (local_628 <
                         (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26
                                >> 5));
              }
              uVar9 = local_608._8_8_;
              uVar23 = local_608._0_8_;
              if (local_608._0_8_ == local_608._8_8_) {
                local_3a8._0_8_ = &local_398;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3a8,
                           "sub-command TRANSFORM, selector AT expects at least one numeric value.",
                           "");
                std::__cxx11::string::_M_assign((string *)psVar18);
                _Var22._M_head_impl = local_3d0._M_head_impl;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._0_8_ != &local_398) {
                  operator_delete((void *)local_3a8._0_8_,
                                  CONCAT26(local_398._M_allocated_capacity._6_2_,
                                           CONCAT15(local_398._M_local_buf[5],
                                                    CONCAT14(local_398._M_local_buf[4],
                                                             CONCAT13(local_398._M_local_buf[3],
                                                                      CONCAT12(local_398.
                                                                               _M_local_buf[2],
                                                                               CONCAT11(local_398.
                                                                                        _M_local_buf
                                                                                        [1],
                                                  local_398._M_local_buf[0])))))) + 1);
                  _Var22._M_head_impl = local_3d0._M_head_impl;
                }
              }
              else {
                _Var22._M_head_impl = (TransformSelector *)operator_new(0x40);
                local_398._M_local_buf[1] = 'T';
                local_398._M_local_buf[2] = '\0';
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&(_Var22._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity =
                     (size_type)&PTR__TransformSelector_008cd2b8;
                ((_Var22._M_head_impl)->Tag)._M_dataplus._M_p =
                     (pointer)&((_Var22._M_head_impl)->Tag).field_2;
                ((_Var22._M_head_impl)->Tag).field_2._M_allocated_capacity =
                     CONCAT26(local_398._M_allocated_capacity._6_2_,
                              CONCAT15(local_398._M_local_buf[5],
                                       CONCAT14(local_398._M_local_buf[4],
                                                CONCAT13(local_398._M_local_buf[3],0x5441))));
                *(ulong *)((long)&((_Var22._M_head_impl)->Tag).field_2 + 8) =
                     CONCAT17(local_398._M_local_buf[0xf],
                              CONCAT25(local_398._13_2_,CONCAT23(local_398._11_2_,local_398._8_3_)))
                ;
                ((_Var22._M_head_impl)->Tag)._M_string_length = 2;
                local_3a8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_398._M_local_buf[0] = '\0';
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&(_Var22._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity =
                     (size_type)&PTR__TransformSelectorIndexes_008cd358;
                local_3a8._0_8_ = &local_398;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)(_Var22._M_head_impl + 1),
                           (vector<int,_std::allocator<int>_> *)local_608);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._0_8_ != &local_398) {
                  operator_delete((void *)local_3a8._0_8_,
                                  CONCAT26(local_398._M_allocated_capacity._6_2_,
                                           CONCAT15(local_398._M_local_buf[5],
                                                    CONCAT14(local_398._M_local_buf[4],
                                                             CONCAT13(local_398._M_local_buf[3],
                                                                      CONCAT12(local_398.
                                                                               _M_local_buf[2],
                                                                               CONCAT11(local_398.
                                                                                        _M_local_buf
                                                                                        [1],
                                                  local_398._M_local_buf[0])))))) + 1);
                }
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&(_Var22._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity =
                     (size_type)&PTR__TransformSelectorIndexes_008cd2f0;
                if ((tuple<(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     )local_3d0._M_head_impl !=
                    (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
                  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)&(local_3d0._M_head_impl)->_vptr_TransformSelector;
                  local_3d0._M_head_impl = _Var22._M_head_impl;
                  (**(code **)(paVar6->_M_allocated_capacity + 8))();
                  _Var22._M_head_impl = local_3d0._M_head_impl;
                }
              }
              local_3d0._M_head_impl = _Var22._M_head_impl;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_608._0_8_,local_608._16_8_ - local_608._0_8_);
              }
              if (uVar23 != uVar9) goto LAB_00330001;
            }
            else {
              if ((__n == local_1a0) &&
                 ((__n == 0 ||
                  (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_1a8,__n), iVar14 == 0)))) {
                uVar27 = (long)local_628 + 2;
                if (uVar27 < uVar32) {
                  local_628 = (_Link_type)((long)local_628 + 1);
                  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)pbVar26[(long)local_628]._M_dataplus._M_p;
                  piVar19 = __errno_location();
                  iVar14 = *piVar19;
                  *piVar19 = 0;
                  lVar31 = strtol(paVar6->_M_local_buf,(char **)local_3a8,10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._0_8_ == paVar6) {
                    uVar23 = std::__throw_invalid_argument("stoi");
LAB_003307f1:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_608._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      operator_delete((void *)local_608._0_8_,local_608._16_8_ - local_608._0_8_);
                    }
                    if ((long *)local_168._M_allocated_capacity != local_158) {
                      operator_delete((void *)local_168._M_allocated_capacity,local_158[0] + 1);
                    }
                    if (local_1a8 != local_198) {
                      operator_delete(local_1a8,local_198[0] + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_598._M_dataplus._M_p != &local_598.field_2) {
                      operator_delete(local_598._M_dataplus._M_p,
                                      local_598.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                      operator_delete(local_5d0._M_dataplus._M_p,
                                      (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
                    }
                    std::
                    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                    ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                            *)&local_538);
                    HandleTransformCommand::Command::~Command((Command *)local_430);
                    _Unwind_Resume(uVar23);
                  }
                  if ((lVar31 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                    std::__throw_out_of_range("stoi");
                  }
                  if (*piVar19 == 0) {
                    *piVar19 = iVar14;
                  }
                  pbVar26 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  lVar20 = 0;
                  if (local_3a8._0_8_ - (long)paVar6 == pbVar26[(long)local_628]._M_string_length) {
                    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)pbVar26[uVar27]._M_dataplus._M_p;
                    iVar14 = *piVar19;
                    *piVar19 = 0;
                    lVar20 = strtol(paVar6->_M_local_buf,(char **)local_3a8,10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a8._0_8_ == paVar6) {
                      uVar23 = std::__throw_invalid_argument("stoi");
                      goto LAB_003307f1;
                    }
                    if ((lVar20 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                      std::__throw_out_of_range("stoi");
                    }
                    if (*piVar19 == 0) {
                      *piVar19 = iVar14;
                    }
                    bVar11 = local_3a8._0_8_ - (long)paVar6 ==
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_string_length;
                    local_628 = (_Link_type)uVar27;
                  }
                  else {
                    bVar11 = false;
                  }
                  if (bVar11) {
                    pbVar26 = (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar27 = (long)local_628 + 1;
                    iVar14 = 1;
                    uVar32 = uVar27;
                    if (uVar27 < (ulong)((long)(args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pbVar26 >> 5)) {
                      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)pbVar26[uVar27]._M_dataplus._M_p;
                      local_59c = *piVar19;
                      *piVar19 = 0;
                      lVar21 = strtol(paVar6->_M_local_buf,(char **)local_3a8,10);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a8._0_8_ == paVar6) {
                        uVar23 = std::__throw_invalid_argument("stoi");
                        goto LAB_003307f1;
                      }
                      if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                        std::__throw_out_of_range("stoi");
                      }
                      if (*piVar19 == 0) {
                        *piVar19 = local_59c;
                      }
                      uVar32 = (long)local_628 + 2;
                      iVar14 = (int)lVar21;
                      if (local_3a8._0_8_ - (long)paVar6 !=
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar27]._M_string_length) {
                        iVar14 = 1;
                        uVar32 = uVar27;
                      }
                    }
                    local_628 = (_Link_type)uVar32;
                    if (iVar14 < 1) {
                      local_3a8._0_8_ = &local_398;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3a8,
                                 "sub-command TRANSFORM, selector FOR expects positive numeric value for <step>."
                                 ,"");
                      std::__cxx11::string::_M_assign((string *)psVar18);
                      goto LAB_0032ffd9;
                    }
                    _Var22._M_head_impl = (TransformSelector *)operator_new(0x50);
                    local_398._M_local_buf[2] = 'R';
                    local_398._M_local_buf[1] = 'O';
                    local_398._M_local_buf[3] = '\0';
                    *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelector_008cd2b8;
                    *(long **)((long)_Var22._M_head_impl + 8) =
                         (long *)((long)_Var22._M_head_impl + 0x18);
                    *(undefined2 *)((long)_Var22._M_head_impl + 0x18) = 0x4f46;
                    *(undefined1 *)((long)_Var22._M_head_impl + 0x1a) = 0x52;
                    *(ulong *)((long)_Var22._M_head_impl + 0x1b) =
                         (ulong)CONCAT34(local_398._8_3_,
                                         CONCAT22(local_398._M_allocated_capacity._6_2_,
                                                  CONCAT11(local_398._M_local_buf[5],
                                                           local_398._M_local_buf[4]))) << 8;
                    *(uint *)((long)_Var22._M_head_impl + 0x23) =
                         CONCAT22(local_398._13_2_,local_398._11_2_);
                    *(char *)((long)_Var22._M_head_impl + 0x27) = local_398._M_local_buf[0xf];
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)_Var22._M_head_impl + 0x10))->_M_allocated_capacity = 3;
                    local_3a8._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_398._M_local_buf[0] = '\0';
                    *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorIndexes_008cd358;
                    *(long *)((long)_Var22._M_head_impl + 0x28) = 0;
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)_Var22._M_head_impl + 0x30))->_M_allocated_capacity = 0;
                    *(long *)((long)_Var22._M_head_impl + 0x38) = 0;
                    *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorIndexes_008cd390;
                    *(int *)((long)_Var22._M_head_impl + 0x40) = (int)lVar31;
                    *(int *)((long)_Var22._M_head_impl + 0x44) = (int)lVar20;
                    *(int *)((long)_Var22._M_head_impl + 0x48) = iVar14;
                    bVar11 = true;
                    local_3a8._0_8_ = &local_398;
                    if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                         )local_3d0._M_head_impl !=
                        (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                         )0x0) {
                      sVar7 = *(size_type *)local_3d0._M_head_impl;
                      local_3d0._M_head_impl = _Var22._M_head_impl;
                      (**(code **)(sVar7 + 8))();
                      _Var22._M_head_impl = local_3d0._M_head_impl;
                    }
                  }
                  else {
                    local_3a8._0_8_ = &local_398;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3a8,
                               "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                               ,"");
                    std::__cxx11::string::_M_assign((string *)psVar18);
LAB_0032ffd9:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a8._0_8_ != &local_398) {
                      operator_delete((void *)local_3a8._0_8_,
                                      CONCAT26(local_398._M_allocated_capacity._6_2_,
                                               CONCAT15(local_398._M_local_buf[5],
                                                        CONCAT14(local_398._M_local_buf[4],
                                                                 CONCAT13(local_398._M_local_buf[3],
                                                                          CONCAT12(local_398.
                                                                                   _M_local_buf[2],
                                                                                   CONCAT11(
                                                  local_398._M_local_buf[1],
                                                  local_398._M_local_buf[0])))))) + 1);
                    }
                    bVar11 = false;
                    _Var22._M_head_impl = local_3d0._M_head_impl;
                  }
                  local_3d0._M_head_impl = _Var22._M_head_impl;
                  if (bVar11) goto LAB_00330001;
                  goto LAB_00330556;
                }
                local_3a8._0_8_ = &local_398;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3a8,
                           "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                           "");
                std::__cxx11::string::_M_assign((string *)psVar18);
              }
              else {
                if ((__n != local_168._8_8_) ||
                   ((__n != 0 &&
                    (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,
                                   (void *)local_168._M_allocated_capacity,__n), iVar14 != 0)))) {
                  local_3a8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x18;
                  local_3a8._8_8_ = "sub-command TRANSFORM, \'";
                  separator_00._M_str = " ";
                  separator_00._M_len = 1;
                  local_40.Begin._M_current = pbVar1;
                  local_40.End._M_current = pbVar30;
                  cmJoin(&local_148,&local_40,separator_00,(string_view)ZEXT816(0));
                  local_608._0_8_ = local_148._M_string_length;
                  local_608._8_8_ = local_148._M_dataplus._M_p;
                  cmStrCat<char[27]>((string *)(local_518 + 0x28),(cmAlphaNum *)local_3a8,
                                     (cmAlphaNum *)local_608,
                                     (char (*) [27])"\': unexpected argument(s).");
                  std::__cxx11::string::_M_assign((string *)psVar18);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(auStack_4ec._0_4_,local_518._40_4_) != &local_4e0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(auStack_4ec._0_4_,local_518._40_4_),
                                    (ulong)(local_4e0._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0033054e;
                  goto LAB_00330556;
                }
                if (uVar32 != (long)local_628 + 1U) {
                  std::__cxx11::string::_M_assign((string *)&((Command *)local_430)->OutputName);
                  goto LAB_0032f9db;
                }
                local_3a8._0_8_ = &local_398;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3a8,
                           "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                           "");
                std::__cxx11::string::_M_assign((string *)psVar18);
              }
LAB_00330539:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._0_8_ != &local_398) {
                local_148.field_2._M_allocated_capacity =
                     (size_type)
                     (pointer)CONCAT26(local_398._M_allocated_capacity._6_2_,
                                       CONCAT15(local_398._M_local_buf[5],
                                                CONCAT14(local_398._M_local_buf[4],
                                                         CONCAT13(local_398._M_local_buf[3],
                                                                  CONCAT12(local_398._M_local_buf[2]
                                                                           ,CONCAT11(local_398.
                                                                                     _M_local_buf[1]
                                                                                     ,local_398.
                                                                                      _M_local_buf
                                                                                      [0]))))));
                local_148._M_dataplus._M_p = (pointer)local_3a8._0_8_;
                goto LAB_0033054e;
              }
            }
            goto LAB_00330556;
          }
          uVar27 = (long)local_628 + 1;
          if (uVar32 == uVar27) {
            local_3a8._0_8_ = &local_398;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3a8,
                       "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                       ,"");
            std::__cxx11::string::_M_assign((string *)psVar18);
            goto LAB_00330539;
          }
          _Var22._M_head_impl = (TransformSelector *)operator_new(0xf8);
          local_3a8._0_8_ = &local_398;
          local_398._M_local_buf[4] = 'X';
          local_398._M_local_buf[0] = 'R';
          local_398._M_local_buf[1] = 'E';
          local_398._M_local_buf[2] = 'G';
          local_398._M_local_buf[3] = 'E';
          local_3a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5;
          local_398._M_local_buf[5] = '\0';
          *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelector_008cd2b8;
          *(long **)((long)_Var22._M_head_impl + 8) = (long *)((long)_Var22._M_head_impl + 0x18);
          *(undefined4 *)((long)_Var22._M_head_impl + 0x18) = 0x45474552;
          *(undefined1 *)((long)_Var22._M_head_impl + 0x1c) = 0x58;
          *(ulong *)((long)_Var22._M_head_impl + 0x1d) =
               (ulong)CONCAT25(local_398._11_2_,
                               CONCAT32(local_398._8_3_,local_398._M_allocated_capacity._6_2_)) << 8
          ;
          *(undefined2 *)((long)_Var22._M_head_impl + 0x25) = local_398._13_2_;
          *(char *)((long)_Var22._M_head_impl + 0x27) = local_398._M_local_buf[0xf];
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)_Var22._M_head_impl + 0x10))->_M_allocated_capacity = 5;
          *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorRegex_008cd258;
          *(long *)((long)_Var22._M_head_impl + 0xd8) = 0;
          *(long *)((long)_Var22._M_head_impl + 0xe8) = 0;
          *(undefined4 *)((long)_Var22._M_head_impl + 0xf0) = 0;
          memset((RegularExpression *)((long)_Var22._M_head_impl + 0x28),0,0xaa);
          cmsys::RegularExpression::compile
                    ((RegularExpression *)((long)_Var22._M_head_impl + 0x28),
                     pbVar26[uVar27]._M_dataplus._M_p);
          if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )local_3d0._M_head_impl != (TransformSelector *)0x0) {
            sVar7 = *(size_type *)local_3d0._M_head_impl;
            local_3d0._M_head_impl = _Var22._M_head_impl;
            (**(code **)(sVar7 + 8))();
            _Var22._M_head_impl = local_3d0._M_head_impl;
          }
          local_3d0._M_head_impl = _Var22._M_head_impl;
          cVar13 = (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)&(local_3d0._M_head_impl)->_vptr_TransformSelector)->
                                _M_allocated_capacity + 0x10))();
          if (cVar13 == '\0') {
            local_3a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x3f;
            local_3a8._8_8_ = "sub-command TRANSFORM, selector REGEX failed to compile regex \"";
            pbVar26 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_608._8_8_ = pbVar26[uVar27]._M_dataplus._M_p;
            local_608._0_8_ = pbVar26[uVar27]._M_string_length;
            cmStrCat<char[3]>((string *)(local_518 + 0x28),(cmAlphaNum *)local_3a8,
                              (cmAlphaNum *)local_608,(char (*) [3])0x6eda00);
            std::__cxx11::string::_M_assign((string *)psVar18);
            local_148._M_dataplus._M_p = (pointer)CONCAT44(auStack_4ec._0_4_,local_518._40_4_);
            local_148.field_2._M_allocated_capacity = local_4e0._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_4e0) goto LAB_0033054e;
            goto LAB_00330556;
          }
LAB_0032f9db:
          local_628 = (_Link_type)((long)local_628 + 2);
LAB_00330001:
          pbVar26 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar30 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          uVar32 = (long)pbVar30 - (long)pbVar26 >> 5;
        } while (local_628 < uVar32);
      }
      pcVar10 = local_5b0;
      local_608._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_608._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_608._16_8_ = (pointer)0x0;
      bVar11 = GetList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_608,&((Command *)local_430)->ListName,local_5b0->Makefile);
      p_Var25 = local_5a8;
      if (bVar11) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_head_impl ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::make_unique<(anonymous_namespace)::TransformNoSelector>();
          uVar23 = local_3a8._0_8_;
          _Var22._M_head_impl = local_3d0._M_head_impl;
          local_3a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_3d0._M_head_impl = (TransformSelector *)uVar23;
          if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )_Var22._M_head_impl !=
              (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )0x0) {
            (**(code **)(*(size_type *)_Var22._M_head_impl + 8))();
          }
        }
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_3d0._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity
                    + 0x20))(local_3d0._M_head_impl,local_608,&p_Var25[2]._M_parent);
        pcVar4 = pcVar10->Makefile;
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin((string *)local_3a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_608,separator,(string_view)ZEXT816(0));
        value_00._M_str = (char *)local_3a8._0_8_;
        value_00._M_len = local_3a8._8_8_;
        cmMakefile::AddDefinition(pcVar4,&((Command *)local_430)->OutputName,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._0_8_ != &local_398) {
          operator_delete((void *)local_3a8._0_8_,
                          CONCAT26(local_398._M_allocated_capacity._6_2_,
                                   CONCAT15(local_398._M_local_buf[5],
                                            CONCAT14(local_398._M_local_buf[4],
                                                     CONCAT13(local_398._M_local_buf[3],
                                                              CONCAT12(local_398._M_local_buf[2],
                                                                       CONCAT11(local_398.
                                                                                _M_local_buf[1],
                                                                                local_398.
                                                                                _M_local_buf[0])))))
                                  ) + 1);
        }
      }
      else {
        cmMakefile::AddDefinition
                  (pcVar10->Makefile,&((Command *)local_430)->OutputName,
                   (string_view)(ZEXT816(0x756ed5) << 0x40));
      }
      bVar11 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_608);
LAB_00330558:
      if ((long *)local_168._M_allocated_capacity != local_158) {
        operator_delete((void *)local_168._M_allocated_capacity,local_158[0] + 1);
      }
      if (local_1a8 != local_198) {
        operator_delete(local_1a8,local_198[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
        operator_delete(local_5d0._M_dataplus._M_p,
                        (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
      }
      goto LAB_003305e3;
    }
    uVar23 = *(undefined8 *)(p_Var15 + 1);
    p_Var28 = p_Var15[1]._M_parent;
    local_3a8._0_8_ = &DAT_0000001e;
    local_3a8._8_8_ = "sub-command TRANSFORM, action ";
    local_398._M_local_buf[0] = (char)p_Var28;
    local_398._M_local_buf[1] = (char)((ulong)p_Var28 >> 8);
    local_398._M_local_buf[2] = (char)((ulong)p_Var28 >> 0x10);
    local_398._M_local_buf[3] = (char)((ulong)p_Var28 >> 0x18);
    local_398._M_local_buf[4] = (char)((ulong)p_Var28 >> 0x20);
    local_398._M_local_buf[5] = (char)((ulong)p_Var28 >> 0x28);
    local_398._M_allocated_capacity._6_2_ = (undefined2)((ulong)p_Var28 >> 0x30);
    local_398._8_3_ = (undefined3)uVar23;
    local_398._11_2_ = (undefined2)((ulong)uVar23 >> 0x18);
    local_398._13_2_ = (undefined2)((ulong)uVar23 >> 0x28);
    local_398._M_local_buf[0xf] = (char)((ulong)uVar23 >> 0x38);
    local_388 = 9;
    local_380 = (Command *)0x7106a2;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_608,p_Var15[2]._M_color);
    paStack_378 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._0_8_;
    local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._8_8_;
    pcStack_368 = (code *)0xd;
    local_360 = " argument(s).";
    views._M_len = 5;
    views._M_array = (iterator)local_3a8;
    cmCatViews_abi_cxx11_(&local_5d0,views);
    std::__cxx11::string::_M_assign((string *)&pcVar10->Error);
    _Var29._M_p = local_5d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) goto LAB_0032f4bc;
  }
  bVar11 = false;
LAB_003305e3:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
          *)&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &(((Command *)local_430)->OutputName).field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)local_3d0._M_head_impl !=
      (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_3d0._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity + 8)
    )();
  }
  local_3d0._M_head_impl = (TransformSelector *)0x0;
  if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
       )_Stack_3d8._M_head_impl != (TransformAction *)0x0) {
    (*(_Stack_3d8._M_head_impl)->_vptr_TransformAction[1])();
  }
  _Stack_3d8._M_head_impl = (TransformAction *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&((Command *)local_430)->Arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &(((Command *)local_430)->ListName).field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &(((Command *)local_430)->Name).field_2) {
    operator_delete((void *)local_430._0_8_,CONCAT71(local_430._17_7_,local_430[0x10]) + 1);
  }
  return bVar11;
}

Assistant:

bool HandleTransformCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return this->Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmTrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    status.SetError(
      cmStrCat(" sub-command TRANSFORM, ", args[index], " invalid action."));
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    status.SetError(cmStrCat("sub-command TRANSFORM, action ",
                             descriptor->Name, " expects ", descriptor->Arity,
                             " argument(s)."));
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action = cm::make_unique<TransformReplace>(
        command.Arguments, &status.GetMakefile());
    } catch (const transform_error& e) {
      status.SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" };
  const std::string AT{ "AT" };
  const std::string FOR{ "FOR" };
  const std::string OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      status.SetError(
        cmStrCat("sub-command TRANSFORM, selector already specified (",
                 command.Selector->Tag, ")."));

      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, selector REGEX expects "
                        "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        status.SetError(
          cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
                   "regex \"",
                   args[index], "\"."));
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        status.SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        status.SetError(
          "sub-command TRANSFORM, selector FOR expects, at least,"
          " two arguments.");
        return false;
      }

      int start = 0;
      int stop = 0;
      int step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        status.SetError("sub-command TRANSFORM, selector FOR expects, "
                        "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step <= 0) {
        status.SetError("sub-command TRANSFORM, selector FOR expects "
                        "positive numeric value for <step>.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                        "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    status.SetError(cmStrCat("sub-command TRANSFORM, '",
                             cmJoin(cmMakeRange(args).advance(index), " "),
                             "': unexpected argument(s)."));
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, command.ListName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    status.SetError(e.what());
    return false;
  }

  status.GetMakefile().AddDefinition(command.OutputName,
                                     cmJoin(varArgsExpanded, ";"));

  return true;
}